

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void grayscale(QImage *image,QImage *dest,QRect *rect)

{
  long lVar1;
  bool bVar2;
  int r;
  int a;
  int iVar3;
  int iVar4;
  QRgb r_00;
  QRgb QVar5;
  long lVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int val_1;
  int x;
  int xd;
  int y;
  int yd;
  int val;
  int i;
  int pixels;
  uint *outData;
  uint *data;
  QRect srcRect;
  QRect destRect;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  QRgb in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  bool local_b9;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRect::isNull((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (bVar2) {
    QImage::rect();
    QImage::rect();
  }
  if (in_RDI != in_RSI) {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    QRect::moveTo((QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  (QPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  lVar6 = QImage::bits();
  lVar7 = QImage::bits();
  QImage::size();
  QImage::size();
  bVar2 = operator==((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QSize *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_b9 = false;
  if (bVar2) {
    QImage::rect();
    local_b9 = operator==((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (QRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  if (local_b9 == false) {
    QRect::top((QRect *)0x4ad8ce);
    local_ac = QRect::top((QRect *)0x4ad8df);
    while( true ) {
      iVar3 = QRect::bottom((QRect *)0x4ad8f8);
      bVar2 = false;
      if (local_ac <= iVar3) {
        iVar3 = QImage::height();
        bVar2 = local_ac < iVar3;
      }
      if (!bVar2) break;
      lVar6 = QImage::scanLine((int)in_RDI);
      lVar7 = QImage::scanLine((int)in_RSI);
      local_b0 = QRect::left((QRect *)0x4ad978);
      local_b4 = QRect::left((QRect *)0x4ad989);
      while( true ) {
        iVar3 = local_b4;
        iVar4 = QRect::right((QRect *)0x4ad9a2);
        bVar2 = false;
        if (iVar3 <= iVar4) {
          iVar3 = local_b4;
          iVar4 = QImage::width();
          bVar2 = iVar3 < iVar4;
        }
        if (!bVar2) break;
        r_00 = qGray(in_stack_ffffffffffffff14);
        in_stack_ffffffffffffff14 = r_00;
        QVar5 = r_00;
        iVar3 = qAlpha(*(QRgb *)(lVar6 + (long)local_b4 * 4));
        QVar5 = qRgba(r_00,in_stack_ffffffffffffff14,QVar5,iVar3);
        *(QRgb *)(lVar7 + (long)local_b0 * 4) = QVar5;
        local_b4 = local_b4 + 1;
        local_b0 = local_b0 + 1;
      }
      local_ac = local_ac + 1;
    }
  }
  else {
    iVar3 = QImage::width();
    iVar4 = QImage::height();
    for (local_a0 = 0; local_a0 < iVar3 * iVar4; local_a0 = local_a0 + 1) {
      r = qGray(in_stack_ffffffffffffff14);
      a = qAlpha(*(QRgb *)(lVar6 + (long)local_a0 * 4));
      QVar5 = qRgba(r,r,r,a);
      *(QRgb *)(lVar7 + (long)local_a0 * 4) = QVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void grayscale(const QImage &image, QImage &dest, const QRect& rect = QRect())
{
    QRect destRect = rect;
    QRect srcRect = rect;
    if (rect.isNull()) {
        srcRect = dest.rect();
        destRect = dest.rect();
    }
    if (&image != &dest) {
        destRect.moveTo(QPoint(0, 0));
    }

    const unsigned int *data = (const unsigned int *)image.bits();
    unsigned int *outData = (unsigned int *)dest.bits();

    if (dest.size() == image.size() && image.rect() == srcRect) {
        // a bit faster loop for grayscaling everything
        int pixels = dest.width() * dest.height();
        for (int i = 0; i < pixels; ++i) {
            int val = qGray(data[i]);
            outData[i] = qRgba(val, val, val, qAlpha(data[i]));
        }
    } else {
        int yd = destRect.top();
        for (int y = srcRect.top(); y <= srcRect.bottom() && y < image.height(); y++) {
            data = (const unsigned int*)image.scanLine(y);
            outData = (unsigned int*)dest.scanLine(yd++);
            int xd = destRect.left();
            for (int x = srcRect.left(); x <= srcRect.right() && x < image.width(); x++) {
                int val = qGray(data[x]);
                outData[xd++] = qRgba(val, val, val, qAlpha(data[x]));
            }
        }
    }
}